

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderTextureImageSamplesTests.cpp
# Opt level: O0

void __thiscall
glcts::ShaderTextureImageSamplesTestBase::executeFunctionalTest
          (ShaderTextureImageSamplesTestBase *this,_sampler_type *sampler_type,_test_type *test_type
          )

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  TestError *pTVar5;
  ulong uVar6;
  string *psVar7;
  char *cs_body_00;
  RenderContext *pRVar8;
  undefined4 extraout_var;
  GLint *pGVar9;
  TestLog *this_00;
  MessageBuilder *pMVar10;
  MessageBuilder local_2c0;
  int local_13c;
  int *piStack_138;
  GLint expected_value;
  void *bo_ptr;
  int max_image_samples;
  int n_value;
  GLenum texture_target;
  GLenum texture_internalformat;
  Functions *gl;
  string sampler_type_token_value;
  size_t sampler_type_token_location;
  string local_e8 [8];
  string sampler_type_token;
  string sampler_type_string;
  string samples_modifier_token_value;
  size_t samples_modifier_token_location;
  string local_78 [8];
  string samples_modifier_token;
  char *cs_template_code;
  string cs_body;
  _test_type *test_type_local;
  _sampler_type *sampler_type_local;
  ShaderTextureImageSamplesTestBase *this_local;
  
  cs_body.field_2._8_8_ = test_type;
  std::__cxx11::string::string((string *)&cs_template_code);
  deinitProgramAndShaderObjects(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,"SAMPLES_MODIFIER",
             (allocator<char> *)((long)&samples_modifier_token_location + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&samples_modifier_token_location + 7));
  std::__cxx11::string::string((string *)(sampler_type_string.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sampler_type_token.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_e8,"SAMPLER_TYPE",(allocator<char> *)((long)&sampler_type_token_location + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&sampler_type_token_location + 7));
  sampler_type_token_value.field_2._8_8_ = 0xffffffffffffffff;
  std::__cxx11::string::string((string *)&gl);
  if (*(int *)cs_body.field_2._8_8_ == 0) {
    std::__cxx11::string::operator=
              ((string *)(sampler_type_string.field_2._M_local_buf + 8),"imageSamples(data);\n");
    switch(*sampler_type) {
    case SAMPLER_TYPE_ISAMPLER2DMS:
      std::__cxx11::string::operator=
                ((string *)(sampler_type_token.field_2._M_local_buf + 8),"iimage2DMS");
      std::__cxx11::string::operator=((string *)&gl,"layout(rgba8i) uniform iimage2DMS");
      break;
    case SAMPLER_TYPE_ISAMPLER2DMSARRAY:
      std::__cxx11::string::operator=
                ((string *)(sampler_type_token.field_2._M_local_buf + 8),"iimage2DMSArray");
      std::__cxx11::string::operator=((string *)&gl,"layout(rgba8i) uniform iimage2DMSArray");
      break;
    case SAMPLER_TYPE_SAMPLER2DMS:
      std::__cxx11::string::operator=
                ((string *)(sampler_type_token.field_2._M_local_buf + 8),"image2DMS");
      std::__cxx11::string::operator=((string *)&gl,"layout(rgba8) uniform image2DMS");
      break;
    case SAMPLER_TYPE_SAMPLER2DMSARRAY:
      std::__cxx11::string::operator=
                ((string *)(sampler_type_token.field_2._M_local_buf + 8),"image2DMSArray");
      std::__cxx11::string::operator=((string *)&gl,"layout(rgba8) uniform image2DMSArray");
      break;
    case SAMPLER_TYPE_USAMPLER2DMS:
      std::__cxx11::string::operator=
                ((string *)(sampler_type_token.field_2._M_local_buf + 8),"uimage2DMS");
      std::__cxx11::string::operator=((string *)&gl,"layout(rgba8ui) uniform uimage2DMS");
      break;
    case SAMPLER_TYPE_USAMPLER2DMSARRAY:
      std::__cxx11::string::operator=
                ((string *)(sampler_type_token.field_2._M_local_buf + 8),"uimage2DMSArray");
      std::__cxx11::string::operator=((string *)&gl,"layout(rgba8ui) uniform uimage2DMSArray");
      break;
    default:
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Unrecognized sampler type",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                 ,0x140);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  else {
    if (*(int *)cs_body.field_2._8_8_ != 1) {
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Unrecognized test type",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                 ,0x188);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    std::__cxx11::string::operator=
              ((string *)(sampler_type_string.field_2._M_local_buf + 8),"textureSamples(data);\n");
    switch(*sampler_type) {
    case SAMPLER_TYPE_ISAMPLER2DMS:
      std::__cxx11::string::operator=
                ((string *)(sampler_type_token.field_2._M_local_buf + 8),"isampler2DMS");
      std::__cxx11::string::operator=((string *)&gl,"uniform isampler2DMS");
      break;
    case SAMPLER_TYPE_ISAMPLER2DMSARRAY:
      std::__cxx11::string::operator=
                ((string *)(sampler_type_token.field_2._M_local_buf + 8),"isampler2DMSArray");
      std::__cxx11::string::operator=((string *)&gl,"uniform isampler2DMSArray");
      break;
    case SAMPLER_TYPE_SAMPLER2DMS:
      std::__cxx11::string::operator=
                ((string *)(sampler_type_token.field_2._M_local_buf + 8),"sampler2DMS");
      std::__cxx11::string::operator=((string *)&gl,"uniform sampler2DMS");
      break;
    case SAMPLER_TYPE_SAMPLER2DMSARRAY:
      std::__cxx11::string::operator=
                ((string *)(sampler_type_token.field_2._M_local_buf + 8),"sampler2DMSArray");
      std::__cxx11::string::operator=((string *)&gl,"uniform sampler2DMSArray");
      break;
    case SAMPLER_TYPE_USAMPLER2DMS:
      std::__cxx11::string::operator=
                ((string *)(sampler_type_token.field_2._M_local_buf + 8),"usampler2DMS");
      std::__cxx11::string::operator=((string *)&gl,"uniform usampler2DMS");
      break;
    case SAMPLER_TYPE_USAMPLER2DMSARRAY:
      std::__cxx11::string::operator=
                ((string *)(sampler_type_token.field_2._M_local_buf + 8),"usampler2DMSArray");
      std::__cxx11::string::operator=((string *)&gl,"uniform usampler2DMSArray");
      break;
    default:
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Unrecognized sampler type",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                 ,0x17f);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  std::__cxx11::string::operator=
            ((string *)&cs_template_code,
             "#version 430\n\n#extension GL_ARB_shader_texture_image_samples : require\n\nlayout(local_size_x = 1) in;\n\nbuffer Result\n{\n    int samples;\n};\n\nSAMPLER_TYPE data;\n\nvoid main()\n{\n    samples = SAMPLES_MODIFIER\n}\n"
            );
  while (uVar6 = std::__cxx11::string::find((string *)&cs_template_code,(ulong)local_78),
        uVar6 != 0xffffffffffffffff) {
    psVar7 = (string *)std::__cxx11::string::length();
    std::__cxx11::string::replace((ulong)&cs_template_code,uVar6,psVar7);
  }
  while (uVar6 = std::__cxx11::string::find((string *)&cs_template_code,(ulong)local_e8),
        sampler_type_token_value.field_2._8_8_ = uVar6, uVar6 != 0xffffffffffffffff) {
    psVar7 = (string *)std::__cxx11::string::length();
    std::__cxx11::string::replace((ulong)&cs_template_code,uVar6,psVar7);
  }
  cs_body_00 = (char *)std::__cxx11::string::c_str();
  bVar2 = buildComputeProgram(this,cs_body_00,true,true);
  if (!bVar2) {
    pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar5,"Could not link a test program",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
               ,0x19c);
    __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pRVar8 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar8->_vptr_RenderContext[3])();
  _texture_target = CONCAT44(extraout_var,iVar3);
  (**(code **)(_texture_target + 0x12c0))(this->m_po_id,0);
  dVar4 = (**(code **)(_texture_target + 0x800))();
  glu::checkError(dVar4,"glShaderStorageBlockBinding() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                  ,0x1a4);
  (**(code **)(_texture_target + 0x48))(0x90d2,0,this->m_bo_id);
  dVar4 = (**(code **)(_texture_target + 0x800))();
  glu::checkError(dVar4,"glBindBufferBase() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                  ,0x1a8);
  if ((*sampler_type == SAMPLER_TYPE_ISAMPLER2DMS) ||
     (*sampler_type == SAMPLER_TYPE_ISAMPLER2DMSARRAY)) {
    n_value = 0x8d8e;
  }
  else if ((*sampler_type == SAMPLER_TYPE_SAMPLER2DMS) ||
          (*sampler_type == SAMPLER_TYPE_SAMPLER2DMSARRAY)) {
    n_value = 0x8058;
  }
  else {
    n_value = 0x8d7c;
  }
  if (((*sampler_type == SAMPLER_TYPE_ISAMPLER2DMS) || (*sampler_type == SAMPLER_TYPE_SAMPLER2DMS))
     || (*sampler_type == SAMPLER_TYPE_USAMPLER2DMS)) {
    max_image_samples = 0x9100;
  }
  else {
    max_image_samples = 0x9102;
  }
  (**(code **)(_texture_target + 0x880))
            (max_image_samples,n_value,0x9380,1,&this->m_internalformat_n_samples_count);
  dVar4 = (**(code **)(_texture_target + 0x800))();
  glu::checkError(dVar4,"glGetInternalformativ() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                  ,0x1ca);
  if (this->m_internalformat_n_samples_count < 1) {
    pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar5,
               "Invalid value returned by glGetInternalformativ() for a GL_NUM_SAMPLE_COUNTS query",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
               ,0x1ce);
    __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)this->m_internalformat_n_samples_count;
  uVar6 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  pGVar9 = (GLint *)operator_new__(uVar6);
  this->m_internalformat_n_samples_data = pGVar9;
  (**(code **)(_texture_target + 0x880))
            (max_image_samples,n_value,0x80a9,this->m_internalformat_n_samples_count,
             this->m_internalformat_n_samples_data);
  dVar4 = (**(code **)(_texture_target + 0x800))();
  glu::checkError(dVar4,"glGetInternalformativ() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                  ,0x1d5);
  bo_ptr._4_4_ = 0;
  do {
    if (this->m_internalformat_n_samples_count <= bo_ptr._4_4_) {
      std::__cxx11::string::~string((string *)&gl);
      std::__cxx11::string::~string(local_e8);
      std::__cxx11::string::~string((string *)(sampler_type_token.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(sampler_type_string.field_2._M_local_buf + 8));
      std::__cxx11::string::~string(local_78);
      std::__cxx11::string::~string((string *)&cs_template_code);
      return;
    }
    if (*(int *)cs_body.field_2._8_8_ == 0) {
      (**(code **)(_texture_target + 0x868))(0x906d,&bo_ptr);
      dVar4 = (**(code **)(_texture_target + 0x800))();
      glu::checkError(dVar4,"glGetIntegerv(GL_MAX_IMAGE_SAMPLES) call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                      ,0x1e3);
      if (this->m_internalformat_n_samples_data[bo_ptr._4_4_] <= (int)bo_ptr) goto LAB_01153312;
    }
    else {
LAB_01153312:
      (**(code **)(_texture_target + 0x6f8))(1,&this->m_to_id);
      dVar4 = (**(code **)(_texture_target + 0x800))();
      glu::checkError(dVar4,"glGenTextures() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                      ,0x1ea);
      (**(code **)(_texture_target + 0xb8))(max_image_samples,this->m_to_id);
      dVar4 = (**(code **)(_texture_target + 0x800))();
      glu::checkError(dVar4,"glBindTexture() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                      ,0x1ed);
      if (max_image_samples == 0x9100) {
        (**(code **)(_texture_target + 0x1390))
                  (0x9100,this->m_internalformat_n_samples_data[bo_ptr._4_4_],n_value,
                   this->m_to_width,this->m_to_height,0);
        dVar4 = (**(code **)(_texture_target + 0x800))();
        glu::checkError(dVar4,"glTexStorage2DMultisample() call failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                        ,499);
      }
      else {
        (**(code **)(_texture_target + 0x13a8))
                  (max_image_samples,this->m_internalformat_n_samples_data[bo_ptr._4_4_],n_value,
                   this->m_to_width,this->m_to_height,this->m_to_depth,1);
        dVar4 = (**(code **)(_texture_target + 0x800))();
        glu::checkError(dVar4,"glTexStorage3DMultisample() call failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                        ,0x1fb);
      }
      if (*(int *)cs_body.field_2._8_8_ == 0) {
        (**(code **)(_texture_target + 0x80))(0,this->m_to_id,0,0,0,35000,n_value);
        dVar4 = (**(code **)(_texture_target + 0x800))();
        glu::checkError(dVar4,"glBindImageTexture() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                        ,0x206);
      }
      (**(code **)(_texture_target + 0x1680))(this->m_po_id);
      dVar4 = (**(code **)(_texture_target + 0x800))();
      glu::checkError(dVar4,"glUseProgram() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                      ,0x20b);
      (**(code **)(_texture_target + 0x528))(1,1);
      dVar4 = (**(code **)(_texture_target + 0x800))();
      glu::checkError(dVar4,"glDispatchCompute() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                      ,0x210);
      (**(code **)(_texture_target + 0xdb8))(0x200);
      dVar4 = (**(code **)(_texture_target + 0x800))();
      glu::checkError(dVar4,"glMemoryBarrier() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                      ,0x213);
      piStack_138 = (int *)(**(code **)(_texture_target + 0xcf8))(0x8892,35000);
      local_13c = 0;
      dVar4 = (**(code **)(_texture_target + 0x800))();
      glu::checkError(dVar4,"glMapBuffer() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                      ,0x219);
      local_13c = this->m_internalformat_n_samples_data[bo_ptr._4_4_];
      if (*piStack_138 != local_13c) {
        this_00 = tcu::TestContext::getLog
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_2c0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar10 = tcu::MessageBuilder::operator<<
                            (&local_2c0,(char (*) [24])"Value reported for the ");
        pMVar10 = tcu::MessageBuilder::operator<<
                            (pMVar10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)((long)&sampler_type_token.field_2 + 8));
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [8])" test [");
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,piStack_138);
        pMVar10 = tcu::MessageBuilder::operator<<
                            (pMVar10,(char (*) [40])"]  is different from the expected one [");
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_13c);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2aea36f);
        tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_2c0);
        pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar5,"Invalid value reported by ES SL function",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                   ,0x224);
        __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      (**(code **)(_texture_target + 0x1670))(0x8892);
      (**(code **)(_texture_target + 0x480))(1,&this->m_to_id);
      this->m_to_id = 0;
      dVar4 = (**(code **)(_texture_target + 0x800))();
      glu::checkError(dVar4,"glDeleteTextures() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                      ,0x22c);
    }
    bo_ptr._4_4_ = bo_ptr._4_4_ + 1;
  } while( true );
}

Assistant:

void ShaderTextureImageSamplesTestBase::executeFunctionalTest(const _sampler_type& sampler_type,
															  const _test_type&	test_type)
{
	std::string cs_body;
	const char* cs_template_code = "#version 430\n"
								   "\n"
								   "#extension GL_ARB_shader_texture_image_samples : require\n"
								   "\n"
								   "layout(local_size_x = 1) in;\n"
								   "\n"
								   "buffer Result\n"
								   "{\n"
								   "    int samples;\n"
								   "};\n"
								   "\n"
								   "SAMPLER_TYPE data;\n"
								   "\n"
								   "void main()\n"
								   "{\n"
								   "    samples = SAMPLES_MODIFIER\n"
								   "}\n";

	/* Any program or shader objects lying around at this point? If so, release them
	 * before we proceed.
	 */
	deinitProgramAndShaderObjects();

	/* Construct the shader body */
	const std::string samples_modifier_token		  = "SAMPLES_MODIFIER";
	size_t			  samples_modifier_token_location = std::string::npos;
	std::string		  samples_modifier_token_value;
	std::string		  sampler_type_string;
	const std::string sampler_type_token		  = "SAMPLER_TYPE";
	size_t			  sampler_type_token_location = std::string::npos;
	std::string		  sampler_type_token_value;

	switch (test_type)
	{
	case TEST_TYPE_IMAGE:
	{
		samples_modifier_token_value = "imageSamples(data);\n";

		switch (sampler_type)
		{
		case SAMPLER_TYPE_ISAMPLER2DMS:
		{
			sampler_type_string		 = "iimage2DMS";
			sampler_type_token_value = "layout(rgba8i) uniform iimage2DMS";

			break;
		}

		case SAMPLER_TYPE_ISAMPLER2DMSARRAY:
		{
			sampler_type_string		 = "iimage2DMSArray";
			sampler_type_token_value = "layout(rgba8i) uniform iimage2DMSArray";

			break;
		}

		case SAMPLER_TYPE_SAMPLER2DMS:
		{
			sampler_type_string		 = "image2DMS";
			sampler_type_token_value = "layout(rgba8) uniform image2DMS";

			break;
		}

		case SAMPLER_TYPE_SAMPLER2DMSARRAY:
		{
			sampler_type_string		 = "image2DMSArray";
			sampler_type_token_value = "layout(rgba8) uniform image2DMSArray";

			break;
		}

		case SAMPLER_TYPE_USAMPLER2DMS:
		{
			sampler_type_string		 = "uimage2DMS";
			sampler_type_token_value = "layout(rgba8ui) uniform uimage2DMS";

			break;
		}

		case SAMPLER_TYPE_USAMPLER2DMSARRAY:
		{
			sampler_type_string		 = "uimage2DMSArray";
			sampler_type_token_value = "layout(rgba8ui) uniform uimage2DMSArray";

			break;
		}

		default:
		{
			TCU_FAIL("Unrecognized sampler type");
		}
		} /* switch (sampler_type) */

		break;
	} /* case TEST_TYPE_IMAGE: */

	case TEST_TYPE_TEXTURE:
	{
		samples_modifier_token_value = "textureSamples(data);\n";

		switch (sampler_type)
		{
		case SAMPLER_TYPE_ISAMPLER2DMS:
		{
			sampler_type_string		 = "isampler2DMS";
			sampler_type_token_value = "uniform isampler2DMS";

			break;
		}

		case SAMPLER_TYPE_ISAMPLER2DMSARRAY:
		{
			sampler_type_string		 = "isampler2DMSArray";
			sampler_type_token_value = "uniform isampler2DMSArray";

			break;
		}

		case SAMPLER_TYPE_SAMPLER2DMS:
		{
			sampler_type_string		 = "sampler2DMS";
			sampler_type_token_value = "uniform sampler2DMS";

			break;
		}

		case SAMPLER_TYPE_SAMPLER2DMSARRAY:
		{
			sampler_type_string		 = "sampler2DMSArray";
			sampler_type_token_value = "uniform sampler2DMSArray";

			break;
		}

		case SAMPLER_TYPE_USAMPLER2DMS:
		{
			sampler_type_string		 = "usampler2DMS";
			sampler_type_token_value = "uniform usampler2DMS";

			break;
		}

		case SAMPLER_TYPE_USAMPLER2DMSARRAY:
		{
			sampler_type_string		 = "usampler2DMSArray";
			sampler_type_token_value = "uniform usampler2DMSArray";

			break;
		}

		default:
		{
			TCU_FAIL("Unrecognized sampler type");
		}
		} /* switch (sampler_type) */

		break;
	} /* case TEST_TYPE_TEXTURE: */

	default:
	{
		TCU_FAIL("Unrecognized test type");
	}
	} /* switch (test_type) */

	cs_body = cs_template_code;

	while ((samples_modifier_token_location = cs_body.find(samples_modifier_token)) != std::string::npos)
	{
		cs_body.replace(samples_modifier_token_location, samples_modifier_token.length(), samples_modifier_token_value);
	}

	while ((sampler_type_token_location = cs_body.find(sampler_type_token)) != std::string::npos)
	{
		cs_body.replace(sampler_type_token_location, sampler_type_token.length(), sampler_type_token_value);
	}

	/* Build the compute program */
	if (!buildComputeProgram(cs_body.c_str(), true, /* should_link_po */
							 true))					/* should_succeed */
	{
		TCU_FAIL("Could not link a test program");
	}

	/* Set up SSBO */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.shaderStorageBlockBinding(m_po_id, 0, /* storageBlockIndex */
								 0);		 /* storageBlockBinding */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderStorageBlockBinding() call failed.");

	gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, /* index */
					  m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() call failed.");

	/* Determine what numbers of samples we can use for GL_RGBA8, GL_RGBA8I
	 * or GL_RGBA8UI internalformats. Specific choice depends on the sampler type
	 * requested bty the caller.
	 */
	glw::GLenum texture_internalformat = GL_NONE;
	glw::GLenum texture_target		   = GL_NONE;

	if (sampler_type == SAMPLER_TYPE_ISAMPLER2DMS || sampler_type == SAMPLER_TYPE_ISAMPLER2DMSARRAY)
	{
		texture_internalformat = GL_RGBA8I;
	}
	else if (sampler_type == SAMPLER_TYPE_SAMPLER2DMS || sampler_type == SAMPLER_TYPE_SAMPLER2DMSARRAY)
	{
		texture_internalformat = GL_RGBA8;
	}
	else
	{
		texture_internalformat = GL_RGBA8UI;
	}

	if (sampler_type == SAMPLER_TYPE_ISAMPLER2DMS || sampler_type == SAMPLER_TYPE_SAMPLER2DMS ||
		sampler_type == SAMPLER_TYPE_USAMPLER2DMS)
	{
		texture_target = GL_TEXTURE_2D_MULTISAMPLE;
	}
	else
	{
		texture_target = GL_TEXTURE_2D_MULTISAMPLE_ARRAY;
	}

	gl.getInternalformativ(texture_target, texture_internalformat, GL_NUM_SAMPLE_COUNTS, 1, /* bufSize */
						   &m_internalformat_n_samples_count);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetInternalformativ() call failed.");

	if (m_internalformat_n_samples_count < 1)
	{
		TCU_FAIL("Invalid value returned by glGetInternalformativ() for a GL_NUM_SAMPLE_COUNTS query");
	}

	m_internalformat_n_samples_data = new glw::GLint[m_internalformat_n_samples_count];

	gl.getInternalformativ(texture_target, texture_internalformat, GL_SAMPLES, m_internalformat_n_samples_count,
						   m_internalformat_n_samples_data);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetInternalformativ() call failed.");

	/* Iterate over all sample counts. For each iteration, set up texture storage,
	 * run one work-item which will store the value retrieved by one of the two new
	 * ES SL functions into the buffer object. Once that happens, map the buffer
	 * object storage contents into process space and validate the value */
	for (int n_value = 0; n_value < m_internalformat_n_samples_count; ++n_value)
	{
		if (test_type == TEST_TYPE_IMAGE)
		{
			/* Shader images do not necessarily support all sample counts. */
			int max_image_samples;

			gl.getIntegerv(GL_MAX_IMAGE_SAMPLES, &max_image_samples);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv(GL_MAX_IMAGE_SAMPLES) call failed.");

			if (m_internalformat_n_samples_data[n_value] > max_image_samples)
				continue;
		}

		gl.genTextures(1, &m_to_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() call failed.");

		gl.bindTexture(texture_target, m_to_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

		if (texture_target == GL_TEXTURE_2D_MULTISAMPLE)
		{
			gl.texStorage2DMultisample(texture_target, m_internalformat_n_samples_data[n_value], texture_internalformat,
									   m_to_width, m_to_height, GL_FALSE); /* fixedsamplelocations */
			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage2DMultisample() call failed");
		}
		else
		{
			DE_ASSERT(texture_target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY);

			gl.texStorage3DMultisample(texture_target, m_internalformat_n_samples_data[n_value], texture_internalformat,
									   m_to_width, m_to_height, m_to_depth, GL_TRUE); /* fixedsamplelocations */
			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage3DMultisample() call failed");
		}

		/* If we're running the "image" test, bind the texture to zeroth image unit */
		if (test_type == TEST_TYPE_IMAGE)
		{
			gl.bindImageTexture(0,			/* unit */
								m_to_id, 0, /* level */
								GL_FALSE,   /* layered */
								0,			/* lyer */
								GL_READ_ONLY, texture_internalformat);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindImageTexture() call failed.");
		}

		/* Dispatch a compute request */
		gl.useProgram(m_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

		gl.dispatchCompute(1,  /* num_groups_x */
						   1,  /* num_groups_y */
						   1); /* num_groups_z */
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute() call failed.");

		gl.memoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glMemoryBarrier() call failed.");

		/* Map the buffer object storage into process space */
		const void* bo_ptr		   = gl.mapBuffer(GL_ARRAY_BUFFER, GL_READ_ONLY);
		glw::GLint  expected_value = 0;

		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer() call failed");

		expected_value = m_internalformat_n_samples_data[n_value];

		if (*(int*)bo_ptr != expected_value)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Value reported for the " << sampler_type_string << " test ["
							   << *(int*)bo_ptr << "] "
												   " is different from the expected one ["
							   << expected_value << "]." << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid value reported by ES SL function");
		}

		/* Safe to unmap the BO at this point */
		gl.unmapBuffer(GL_ARRAY_BUFFER);

		gl.deleteTextures(1, &m_to_id);
		m_to_id = 0;
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteTextures() call failed.");
	} /* for (all "n samples" values) */
}